

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf_utilities.cpp
# Opt level: O1

Matrix3d * ins_ekf::SkewSymmetric(Matrix3d *__return_storage_ptr__,Vector3d *vect)

{
  double *s;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_60;
  Scalar local_40;
  Scalar local_38;
  double local_30;
  Scalar local_28;
  double local_20;
  
  local_60.m_row = 0;
  local_60.m_col = 1;
  local_60.m_currentBlockRows = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = 0.0;
  local_20 = -(vect->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2];
  local_60.m_xpr = __return_storage_ptr__;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_60,&local_20);
  s = (vect->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
      1;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,s);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,(vect->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                             m_storage.m_data.array + 2);
  local_28 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_28);
  local_30 = -(vect->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_30);
  local_38 = -*s;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_38);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,(Scalar *)vect);
  local_40 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&local_40);
  if ((local_60.m_currentBlockRows + local_60.m_row == 3) && (local_60.m_col == 3)) {
    return __return_storage_ptr__;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
               );
}

Assistant:

Eigen::Matrix3d SkewSymmetric(const Eigen::Vector3d& vect){

        Eigen::Matrix3d ss;
        ss << 0, -vect[2], vect[1],
                vect[2], 0, -vect[0],
                -vect[1], vect[0], 0;
        return ss;
    }